

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanel_dfs.c
# Opt level: O1

void spanel_dfs(int m,int w,int jcol,SuperMatrix *A,int *perm_r,int *nseg,float *dense,
               int *panel_lsub,int *segrep,int *repfnz,int_t *xprune,int *marker,int *parent,
               int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  int_t *piVar9;
  int_t *piVar10;
  int *piVar11;
  int_t *piVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  lVar5 = *(long *)((long)pvVar3 + 0x10);
  lVar6 = *(long *)((long)pvVar3 + 0x18);
  lVar7 = *(long *)((long)pvVar3 + 0x20);
  *nseg = 0;
  if (0 < w) {
    piVar8 = Glu->supno;
    piVar9 = Glu->lsub;
    piVar10 = Glu->xlsub;
    piVar11 = Glu->xsup;
    lVar17 = (long)jcol;
    do {
      iVar16 = *(int *)(lVar6 + lVar17 * 4);
      lVar15 = (long)iVar16;
      if (iVar16 < *(int *)(lVar7 + lVar17 * 4)) {
        iVar16 = (int)lVar17;
        iVar18 = (iVar16 - jcol) * m;
        do {
          iVar21 = *(int *)(lVar5 + lVar15 * 4);
          dense[iVar21] = *(float *)(lVar4 + lVar15 * 4);
          if (marker[iVar21] != iVar16) {
            marker[iVar21] = iVar16;
            iVar20 = perm_r[iVar21];
            if ((long)iVar20 == -1) {
              lVar19 = (long)iVar18;
              iVar18 = iVar18 + 1;
              panel_lsub[lVar19] = iVar21;
            }
            else {
              lVar19 = (long)piVar11[(long)piVar8[iVar20] + 1];
              if (repfnz[lVar19 + -1] == -1) {
                lVar14 = lVar19 + -1;
                parent[lVar19 + -1] = -1;
                repfnz[lVar19 + -1] = iVar20;
                piVar12 = piVar10;
                do {
                  iVar21 = xprune[lVar14];
                  iVar20 = piVar12[lVar14];
                  while (iVar13 = (int)lVar14, iVar20 < iVar21) {
                    iVar1 = piVar9[iVar20];
                    iVar20 = iVar20 + 1;
                    if (marker[iVar1] != iVar16) {
                      marker[iVar1] = iVar16;
                      iVar2 = perm_r[iVar1];
                      if ((long)iVar2 == -1) {
                        lVar19 = (long)iVar18;
                        iVar18 = iVar18 + 1;
                        panel_lsub[lVar19] = iVar1;
                      }
                      else {
                        lVar19 = (long)piVar11[(long)piVar8[iVar2] + 1];
                        if (repfnz[lVar19 + -1] == -1) {
                          lVar14 = lVar19 + -1;
                          xplore[iVar13] = iVar20;
                          parent[lVar19 + -1] = iVar13;
                          repfnz[lVar19 + -1] = iVar2;
                          iVar20 = piVar10[lVar19 + -1];
                          iVar21 = xprune[lVar19 + -1];
                        }
                        else if (iVar2 < repfnz[lVar19 + -1]) {
                          repfnz[lVar19 + -1] = iVar2;
                        }
                      }
                    }
                  }
                  if (marker[(long)m + (long)iVar13] < jcol) {
                    segrep[*nseg] = iVar13;
                    *nseg = *nseg + 1;
                    marker[(long)m + (long)iVar13] = iVar16;
                  }
                  lVar14 = (long)parent[iVar13];
                  piVar12 = xplore;
                } while (lVar14 != -1);
              }
              else if (iVar20 < repfnz[lVar19 + -1]) {
                repfnz[lVar19 + -1] = iVar20;
              }
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)(lVar7 + lVar17 * 4));
      }
      repfnz = repfnz + m;
      dense = dense + m;
      lVar17 = lVar17 + 1;
    } while (lVar17 < w + jcol);
  }
  return;
}

Assistant:

void
spanel_dfs (
	   const int  m,           /* in - number of rows in the matrix */
	   const int  w,           /* in */
	   const int  jcol,        /* in */
	   SuperMatrix *A,       /* in - original matrix */
	   int        *perm_r,     /* in */
	   int        *nseg,	   /* out */
	   float     *dense,      /* out */
	   int        *panel_lsub, /* out */
	   int        *segrep,     /* out */
	   int        *repfnz,     /* out */
	   int_t      *xprune,     /* out */
	   int        *marker,     /* out */     
	   int        *parent,     /* working array */
	   int_t      *xplore,     /* working array */
	   GlobalLU_t *Glu         /* modified */
	   )
{

    NCPformat *Astore;
    float    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end, k;
    int       krow, kmark, kperm;
    int	      krep, chperm, chmark, chrep, oldrep, kchild, myfnz, kpar;
    int       jj;	   /* index through each column in the panel */
    int       *marker1;	   /* marker1[jj] >= jcol if vertex jj was visited 
			      by a previous column within this panel.   */
    int       *repfnz_col; /* start of each column in the panel */
    float    *dense_col;  /* start of each column in the panel */
    int_t     nextl_col;   /* next available position in panel_lsub[*,jj] */
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    int_t      xdfs, maxdfs;

    /* Initialize pointers */
    Astore     = A->Store;
    a          = Astore->nzval;
    asub       = Astore->rowind;
    xa_begin   = Astore->colbeg;
    xa_end     = Astore->colend;
    marker1    = marker + m;
    repfnz_col = repfnz;
    dense_col  = dense;
    *nseg      = 0;
    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;

    /* For each column in the panel */
    for (jj = jcol; jj < jcol + w; jj++) {
	nextl_col = (jj - jcol) * m;

#ifdef CHK_DFS
	printf("\npanel col %d: ", jj);
#endif

	/* For each nonz in A[*,jj] do dfs */
	for (k = xa_begin[jj]; k < xa_end[jj]; k++) {
	    krow = asub[k];
            dense_col[krow] = a[k];
	    kmark = marker[krow];    	
	    if ( kmark == jj ) 
		continue;     /* krow visited before, go to the next nonzero */

	    /* For each unmarked nbr krow of jj
	     * krow is in L: place it in structure of L[*,jj]
	     */
	    marker[krow] = jj;
	    kperm = perm_r[krow];
	    
	    if ( kperm == SLU_EMPTY ) {
		panel_lsub[nextl_col++] = krow; /* krow is indexed into A */
	    }
	    /* 
	     * krow is in U: if its supernode-rep krep
	     * has been explored, update repfnz[*]
	     */
	    else {
		
		krep = xsup[supno[kperm]+1] - 1;
		myfnz = repfnz_col[krep];
		
#ifdef CHK_DFS
		printf("krep %d, myfnz %d, perm_r[%d] %d\n", krep, myfnz, krow, kperm);
#endif
		if ( myfnz != SLU_EMPTY ) {	/* Representative visited before */
		    if ( myfnz > kperm ) repfnz_col[krep] = kperm;
		    /* continue; */
		}
		else {
		    /* Otherwise, perform dfs starting at krep */
		    oldrep = SLU_EMPTY;
		    parent[krep] = oldrep;
		    repfnz_col[krep] = kperm;
		    xdfs = xlsub[krep];
		    maxdfs = xprune[krep];
		    
#ifdef CHK_DFS 
		    printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
		    for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
		    printf("\n");
#endif
		    do {
			/* 
			 * For each unmarked kchild of krep 
			 */
			while ( xdfs < maxdfs ) {
			    
			    kchild = lsub[xdfs];
			    xdfs++;
			    chmark = marker[kchild];
			    
			    if ( chmark != jj ) { /* Not reached yet */
				marker[kchild] = jj;
				chperm = perm_r[kchild];
			      
				/* Case kchild is in L: place it in L[*,j] */
				if ( chperm == SLU_EMPTY ) {
				    panel_lsub[nextl_col++] = kchild;
				} 
				/* Case kchild is in U: 
				 *   chrep = its supernode-rep. If its rep has 
				 *   been explored, update its repfnz[*]
				 */
				else {
				    
				    chrep = xsup[supno[chperm]+1] - 1;
				    myfnz = repfnz_col[chrep];
#ifdef CHK_DFS
				    printf("chrep %d,myfnz %d,perm_r[%d] %d\n",chrep,myfnz,kchild,chperm);
#endif
				    if ( myfnz != SLU_EMPTY ) { /* Visited before */
					if ( myfnz > chperm )
					    repfnz_col[chrep] = chperm;
				    }
				    else {
					/* Cont. dfs at snode-rep of kchild */
					xplore[krep] = xdfs;	
					oldrep = krep;
					krep = chrep; /* Go deeper down G(L) */
					parent[krep] = oldrep;
					repfnz_col[krep] = chperm;
					xdfs = xlsub[krep];     
					maxdfs = xprune[krep];
#ifdef CHK_DFS 
					printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
					for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);	
					printf("\n");
#endif
				    } /* else */
				  
				} /* else */
			      
			    } /* if... */
			    
			} /* while xdfs < maxdfs */
			
			/* krow has no more unexplored nbrs:
			 *    Place snode-rep krep in postorder DFS, if this 
			 *    segment is seen for the first time. (Note that
			 *    "repfnz[krep]" may change later.)
			 *    Backtrack dfs to its parent.
			 */
			if ( marker1[krep] < jcol ) {
			    segrep[*nseg] = krep;
			    ++(*nseg);
			    marker1[krep] = jj;
			}
			
			kpar = parent[krep]; /* Pop stack, mimic recursion */
			if ( kpar == SLU_EMPTY ) break; /* dfs done */
			krep = kpar;
			xdfs = xplore[krep];
			maxdfs = xprune[krep];
			
#ifdef CHK_DFS 
			printf("  pop stack: krep %d,xdfs %d,maxdfs %d: ", krep,xdfs,maxdfs);
			for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
			printf("\n");
#endif
		    } while ( kpar != SLU_EMPTY ); /* do-while - until empty stack */
		    
		} /* else */
		
	    } /* else */
	    
	} /* for each nonz in A[*,jj] */
	
	repfnz_col += m;    /* Move to next column */
        dense_col += m;
	
    } /* for jj ... */
    
}